

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_join.cpp
# Opt level: O2

void __thiscall duckdb::LogicalJoin::ResolveTypes(LogicalJoin *this)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_00;
  vector<duckdb::LogicalType,_true> *this_01;
  byte bVar1;
  reference pvVar2;
  pointer pLVar3;
  vector<duckdb::LogicalType,_true> right_types;
  
  this_00 = &(this->super_LogicalOperator).children;
  pvVar2 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(this_00,0);
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar2);
  LogicalOperator::MapTypes(&right_types,&pLVar3->types,&this->left_projection_map);
  this_01 = &(this->super_LogicalOperator).types;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
            (&this_01->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &right_types);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&right_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  bVar1 = (this->super_LogicalOperator).field_0x61;
  if (1 < bVar1 - 5) {
    if (bVar1 == 7) {
      ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalTypeId_const&>
                ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)this_01,
                 &LogicalType::BOOLEAN);
    }
    else {
      pvVar2 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(this_00,1);
      pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(pvVar2);
      LogicalOperator::MapTypes(&right_types,&pLVar3->types,&this->right_projection_map);
      if ((byte)((this->super_LogicalOperator).field_0x61 - 9) < 2) {
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                  (&this_01->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                   ,&right_types.
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      }
      else {
        ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
        insert<__gnu_cxx::__normal_iterator<duckdb::LogicalType*,std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>>,void>
                  ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)this_01,
                   (this->super_LogicalOperator).types.
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                    )right_types.
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                    )right_types.
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
      }
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                (&right_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    }
  }
  return;
}

Assistant:

void LogicalJoin::ResolveTypes() {
	types = MapTypes(children[0]->types, left_projection_map);
	if (join_type == JoinType::SEMI || join_type == JoinType::ANTI) {
		// for SEMI and ANTI join we only project the left hand side
		return;
	}
	if (join_type == JoinType::MARK) {
		// for MARK join we project the left hand side, plus a BOOLEAN column indicating the MARK
		types.emplace_back(LogicalType::BOOLEAN);
		return;
	}
	// for any other join we project both sides
	auto right_types = MapTypes(children[1]->types, right_projection_map);
	if (join_type == JoinType::RIGHT_SEMI || join_type == JoinType::RIGHT_ANTI) {
		types = right_types;
		return;
	}
	types.insert(types.end(), right_types.begin(), right_types.end());
}